

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

void PDHG_Check_Data(CUPDLPwork *work)

{
  double *pdVar1;
  double dVar2;
  long *plVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined8 *in_RDI;
  cupdlp_int iRow_1;
  cupdlp_int iRow;
  cupdlp_bool hasUpper_1;
  cupdlp_bool hasLower_1;
  cupdlp_int iSeq_1;
  cupdlp_bool hasUpper;
  cupdlp_bool hasLower;
  cupdlp_int iSeq;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  cupdlp_int nRangedRow;
  cupdlp_int nLowerRow;
  cupdlp_int nUpperRow;
  cupdlp_int nFixedRow;
  cupdlp_int nFreeRow;
  cupdlp_int nRangedCol;
  cupdlp_int nLowerCol;
  cupdlp_int nUpperCol;
  cupdlp_int nFixedCol;
  cupdlp_int nFreeCol;
  CUPDLPiterates *iterates;
  CUPDLPstepsize *stepsize;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  uint local_80;
  int local_7c;
  int local_74;
  uint local_6c;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  plVar3 = (long *)*in_RDI;
  piVar4 = (int *)*plVar3;
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  for (local_6c = 0; (int)local_6c < piVar4[1]; local_6c = local_6c + 1) {
    bVar7 = -INFINITY < *(double *)(plVar3[1] + (long)(int)local_6c * 8);
    pdVar1 = (double *)(plVar3[2] + (long)(int)local_6c * 8);
    bVar5 = *pdVar1 != INFINITY;
    bVar6 = *pdVar1 <= INFINITY;
    if (((!bVar7) && (!bVar6 || !bVar5)) &&
       (local_2c = local_2c + 1, 0 < *(int *)(in_RDI[1] + 0x38))) {
      printf("Warning: variable %d is free.",(ulong)local_6c);
    }
    if ((bVar7) && (bVar6 && bVar5)) {
      dVar2 = *(double *)(plVar3[1] + (long)(int)local_6c * 8);
      pdVar1 = (double *)(plVar3[2] + (long)(int)local_6c * 8);
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        local_3c = local_3c + 1;
      }
      else {
        local_30 = local_30 + 1;
      }
    }
    if (bVar7) {
      local_38 = (((bVar6 && bVar5) ^ 0xffU) & 1) + local_38;
    }
    if (bVar6 && bVar5) {
      local_34 = ((bVar7 ^ 0xffU) & 1) + local_34;
    }
  }
  for (local_74 = piVar4[1]; local_74 < piVar4[1]; local_74 = local_74 + 1) {
    bVar7 = -INFINITY < *(double *)(plVar3[1] + (long)local_74 * 8);
    pdVar1 = (double *)(plVar3[2] + (long)local_74 * 8);
    bVar5 = *pdVar1 != INFINITY;
    bVar6 = *pdVar1 <= INFINITY;
    if (((!bVar7) && (!bVar6 || !bVar5)) &&
       (local_40 = local_40 + 1, 0 < *(int *)(in_RDI[1] + 0x38))) {
      printf("Warning: row %d is free.",(ulong)(uint)(local_74 - piVar4[1]));
    }
    if ((bVar7) && (bVar6 && bVar5)) {
      dVar2 = *(double *)(plVar3[1] + (long)local_74 * 8);
      pdVar1 = (double *)(plVar3[2] + (long)local_74 * 8);
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        local_50 = local_50 + 1;
      }
      else {
        local_44 = local_44 + 1;
      }
    }
    if (bVar7) {
      local_4c = (((bVar6 && bVar5) ^ 0xffU) & 1) + local_4c;
    }
    if (bVar6 && bVar5) {
      local_48 = ((bVar7 ^ 0xffU) & 1) + local_48;
    }
  }
  for (local_7c = 0; local_7c < *piVar4; local_7c = local_7c + 1) {
  }
  for (local_80 = 0; (int)local_80 < *piVar4; local_80 = local_80 + 1) {
    if ((*(int *)(*(long *)(*(long *)(*plVar3 + 0x18) + 0x10) + (long)(int)(local_80 + 1) * 4) -
         *(int *)(*(long *)(*(long *)(*plVar3 + 0x18) + 0x10) + (long)(int)local_80 * 4) == 1) &&
       (0 < *(int *)(in_RDI[1] + 0x38))) {
      printf("Warning: row %d is a singleton row.",(ulong)local_80);
    }
  }
  if (0 < *(int *)(in_RDI[1] + 0x38)) {
    printf("nFreeCol  : %d\n",(ulong)local_2c);
    printf("nFixedCol : %d\n",(ulong)local_30);
    printf("nRangedCol: %d\n",(ulong)local_3c);
    printf("nLowerCol : %d\n",(ulong)local_38);
    printf("nUpperCol : %d\n",(ulong)local_34);
    printf("nFreeRow  : %d\n",(ulong)local_40);
    printf("nFixedRow : %d\n",(ulong)local_44);
    printf("nRangedRow: %d\n",(ulong)local_50);
    printf("nLowerRow : %d\n",(ulong)local_4c);
    printf("nUpperRow : %d\n",(ulong)local_48);
  }
  return;
}

Assistant:

void PDHG_Check_Data(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;
  cupdlp_int nFreeCol = 0;
  cupdlp_int nFixedCol = 0;
  cupdlp_int nUpperCol = 0;
  cupdlp_int nLowerCol = 0;
  cupdlp_int nRangedCol = 0;
  cupdlp_int nFreeRow = 0;
  cupdlp_int nFixedRow = 0;
  cupdlp_int nUpperRow = 0;
  cupdlp_int nLowerRow = 0;
  cupdlp_int nRangedRow = 0;


  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];

  for (cupdlp_int iSeq = 0; iSeq < lp->nCols; ++iSeq) {
    cupdlp_bool hasLower = problem->lower[iSeq] > -INFINITY;
    cupdlp_bool hasUpper = problem->upper[iSeq] < +INFINITY;

    if (!hasLower && !hasUpper) {
      ++nFreeCol;
      if (work->settings->nLogLevel>0) 
	cupdlp_printf("Warning: variable %d is free.", iSeq);
    }

    if (hasLower && hasUpper) {
      if (problem->lower[iSeq] == problem->upper[iSeq]) {
        ++nFixedCol;
        // cupdlp_printf( "Warning: variable %d is fixed.", iSeq);
      } else
        ++nRangedCol;
    }

    if (hasLower) {
      // XXX: uncommented for PDLP comparison
      // CUPDLP_ASSERT(x[iSeq] >= problem->lower[iSeq]);
      nLowerCol += !hasUpper;
    }

    if (hasUpper) {
      // XXX: uncommented for PDLP comparison
      // CUPDLP_ASSERT(x[iSeq] <= problem->upper[iSeq]);
      nUpperCol += !hasLower;
    }
  }

  for (cupdlp_int iSeq = lp->nCols; iSeq < lp->nCols; ++iSeq) {
    cupdlp_bool hasLower = problem->lower[iSeq] > -INFINITY;
    cupdlp_bool hasUpper = problem->upper[iSeq] < +INFINITY;

    if (!hasLower && !hasUpper) {
      ++nFreeRow;
      if (work->settings->nLogLevel>0) 
	cupdlp_printf("Warning: row %d is free.", iSeq - lp->nCols);
    }

    if (hasLower && hasUpper) {
      if (problem->lower[iSeq] == problem->upper[iSeq])
        ++nFixedRow;
      else
        ++nRangedRow;
    }

    if (hasLower) {
      // CUPDLP_ASSERT(x[iSeq] >= problem->lower[iSeq]);
      nLowerRow += !hasUpper;
    }

    if (hasUpper) {
      // CUPDLP_ASSERT(x[iSeq] <= problem->upper[iSeq]);
      nUpperRow += !hasLower;
    }
  }

  for (cupdlp_int iRow = 0; iRow < lp->nRows; ++iRow) {
    CUPDLP_ASSERT(y->data[iRow] < +INFINITY);
    CUPDLP_ASSERT(y->data[iRow] > -INFINITY);
  }

  for (cupdlp_int iRow = 0; iRow < lp->nRows; ++iRow) {
    if (problem->data->csr_matrix->rowMatBeg[iRow + 1] -
            problem->data->csr_matrix->rowMatBeg[iRow] ==
        1) {
      if (work->settings->nLogLevel>0) 
	cupdlp_printf("Warning: row %d is a singleton row.", iRow);
    }
  }

  CUPDLP_ASSERT(nRangedRow == 0);
  if (work->settings->nLogLevel>0) {
    cupdlp_printf("nFreeCol  : %d\n", nFreeCol);
    cupdlp_printf("nFixedCol : %d\n", nFixedCol);
    cupdlp_printf("nRangedCol: %d\n", nRangedCol);
    cupdlp_printf("nLowerCol : %d\n", nLowerCol);
    cupdlp_printf("nUpperCol : %d\n", nUpperCol);
    cupdlp_printf("nFreeRow  : %d\n", nFreeRow);
    cupdlp_printf("nFixedRow : %d\n", nFixedRow);
    cupdlp_printf("nRangedRow: %d\n", nRangedRow);
    cupdlp_printf("nLowerRow : %d\n", nLowerRow);
    cupdlp_printf("nUpperRow : %d\n", nUpperRow);
  }

  // We need to test problems ranged row-bounds more carefully.
  CUPDLP_ASSERT(nRangedRow == 0);
}